

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void remove_stone_from_lookup(event_path_data evp,int stone_num)

{
  int stone;
  int i;
  int stone_num_local;
  event_path_data evp_local;
  
  stone = -1;
  i = 0;
  do {
    if (evp->stone_lookup_table_size <= i) {
LAB_0013b8c7:
      if (stone != -1) {
        for (i = stone; i < evp->stone_lookup_table_size + -1; i = i + 1) {
          evp->stone_lookup_table[i] = evp->stone_lookup_table[i + 1];
        }
      }
      return;
    }
    if (evp->stone_lookup_table[i].global_id == stone_num) {
      stone = i;
      goto LAB_0013b8c7;
    }
    i = i + 1;
  } while( true );
}

Assistant:

extern void
remove_stone_from_lookup(event_path_data evp, int stone_num)
{
    int i, stone = -1;
    for (i=0; i < evp->stone_lookup_table_size; i++) {
	if (evp->stone_lookup_table[i].global_id == stone_num) {
	    stone = i;
	    break;
	}
    }
    if (stone == -1) return;
    for (i=stone; i < evp->stone_lookup_table_size-1; i++) {
	evp->stone_lookup_table[i] = evp->stone_lookup_table[i+1];
    }
}